

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhstsstore.cpp
# Opt level: O2

void __thiscall QHstsStore::QHstsStore(QHstsStore *this,QString *dirName)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (this->observedPolicies).d.d = (Data *)0x0;
  (this->observedPolicies).d.ptr = (QHstsPolicy *)0x0;
  (this->observedPolicies).d.size = 0;
  absoluteFilePath((QString *)&local_30,dirName);
  QSettings::QSettings(&this->store,(QString *)&local_30,IniFormat,(QObject *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  QSettings::setFallbacksEnabled(SUB81(&this->store,0));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QHstsStore::QHstsStore(const QString &dirName)
    : store(absoluteFilePath(dirName), QSettings::IniFormat)
{
    // Disable fallbacks, we do not want to use anything but our own ini file.
    store.setFallbacksEnabled(false);
}